

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O3

void duckdb::ListHasAnyFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong *puVar5;
  __buckets_ptr pp_Var6;
  sel_t *psVar7;
  sel_t *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  SelectionVector *pSVar12;
  bool bVar13;
  data_t dVar14;
  reference vec;
  reference vec_00;
  LogicalType *pLVar15;
  idx_t iVar16;
  idx_t iVar17;
  Vector *this_00;
  Vector *this_01;
  idx_t iVar18;
  iterator iVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  ulong uVar22;
  long lVar23;
  uint64_t idx_3;
  ulong uVar24;
  ulong uVar25;
  data_ptr_t pdVar26;
  UnifiedVectorFormat *pUVar27;
  uint64_t idx_9;
  ulong uVar28;
  data_ptr_t pdVar29;
  ulong uVar30;
  data_ptr_t pdVar31;
  idx_t iVar32;
  uint64_t idx_14;
  ValidityMask *this_02;
  uint64_t idx;
  ulong uVar33;
  uint64_t idx_1;
  ulong uVar34;
  ulong uVar35;
  idx_t idx_in_entry;
  ulong uVar36;
  ulong uVar37;
  string_set_t set;
  UnifiedVectorFormat r_child_format;
  UnifiedVectorFormat l_child_format;
  UnifiedVectorFormat ldata;
  Vector r_sortkey_vec;
  Vector l_sortkey_vec;
  UnifiedVectorFormat *local_318;
  UnifiedVectorFormat *local_310;
  UnifiedVectorFormat *local_308;
  data_ptr_t local_300;
  UnifiedVectorFormat *local_2f8;
  UnifiedVectorFormat *local_2e8;
  data_ptr_t local_2e0;
  UnifiedVectorFormat *local_2c8;
  data_ptr_t local_2c0;
  ulong local_2b0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2a0;
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_268;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_260;
  UnifiedVectorFormat local_258;
  UnifiedVectorFormat local_210;
  UnifiedVectorFormat local_1c8;
  idx_t local_180;
  LogicalType local_178;
  LogicalType local_160;
  UnifiedVectorFormat local_148;
  Vector local_100;
  Vector local_98;
  
  vec = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vec_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  pLVar15 = ListType::GetChildType(&vec->type);
  LogicalType::LogicalType((LogicalType *)&local_98,SQLNULL);
  bVar13 = LogicalType::operator==(pLVar15,(LogicalType *)&local_98);
  if (bVar13) {
    LogicalType::~LogicalType((LogicalType *)&local_98);
LAB_01b9a92f:
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    *result->data = '\0';
    return;
  }
  pLVar15 = ListType::GetChildType(&vec_00->type);
  LogicalType::LogicalType((LogicalType *)&local_100,SQLNULL);
  bVar13 = LogicalType::operator==(pLVar15,(LogicalType *)&local_100);
  LogicalType::~LogicalType((LogicalType *)&local_100);
  LogicalType::~LogicalType((LogicalType *)&local_98);
  if (bVar13) goto LAB_01b9a92f;
  iVar16 = ListVector::GetListSize(vec);
  iVar17 = ListVector::GetListSize(vec_00);
  this_00 = ListVector::GetEntry(vec);
  this_01 = ListVector::GetEntry(vec_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_210);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_258);
  Vector::ToUnifiedFormat(this_00,iVar16,&local_210);
  Vector::ToUnifiedFormat(this_01,iVar17,&local_258);
  LogicalType::LogicalType(&local_160,BLOB);
  Vector::Vector(&local_98,&local_160,iVar16);
  LogicalType::~LogicalType(&local_160);
  LogicalType::LogicalType(&local_178,BLOB);
  Vector::Vector(&local_100,&local_178,iVar17);
  LogicalType::~LogicalType(&local_178);
  CreateSortKeyHelpers::CreateSortKey(this_00,iVar16,(OrderModifiers)0x302,&local_98);
  CreateSortKeyHelpers::CreateSortKey(this_01,iVar17,(OrderModifiers)0x302,&local_100);
  local_2e0 = local_100.data;
  local_2a0._M_buckets = &local_2a0._M_single_bucket;
  local_2a0._M_bucket_count = 1;
  local_2a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2a0._M_element_count = 0;
  local_2a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_2a0._M_rehash_policy._M_next_resize = 0;
  local_2a0._M_single_bucket = (__node_base_ptr)0x0;
  VVar1 = vec->vector_type;
  VVar2 = vec_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar4 = result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      uVar22 = *(ulong *)((long)vec->data + 8);
      dVar14 = '\0';
      if ((uVar22 != 0) && (uVar37 = *(ulong *)((long)vec_00->data + 8), uVar37 != 0)) {
        uVar36 = *(ulong *)vec->data;
        uVar35 = *(ulong *)vec_00->data;
        if (uVar37 < uVar22) {
          local_2f8 = &local_210;
          pUVar27 = &local_258;
          local_318 = (UnifiedVectorFormat *)local_100.data;
          local_2e0 = local_98.data;
          uVar30 = uVar37;
          uVar33 = uVar35;
          uVar35 = uVar36;
          uVar37 = uVar22;
        }
        else {
          local_2f8 = &local_258;
          pUVar27 = &local_210;
          local_318 = (UnifiedVectorFormat *)local_98.data;
          uVar30 = uVar22;
          uVar33 = uVar36;
        }
        ::std::
        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&local_2a0);
        if (uVar33 < uVar30 + uVar33) {
          do {
            psVar8 = pUVar27->sel->sel_vector;
            uVar22 = uVar33;
            if (psVar8 != (sel_t *)0x0) {
              uVar22 = (ulong)psVar8[uVar33];
            }
            puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar3 == (unsigned_long *)0x0) ||
               ((puVar3[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) {
              local_1c8.sel = (SelectionVector *)&local_2a0;
              ::std::
              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_2a0,(data_ptr_t)((long)local_318 + uVar22 * 0x10),&local_1c8);
            }
            uVar33 = uVar33 + 1;
            uVar30 = uVar30 - 1;
          } while (uVar30 != 0);
        }
        if (uVar35 < uVar37 + uVar35) {
          do {
            psVar8 = local_2f8->sel->sel_vector;
            uVar22 = uVar35;
            if (psVar8 != (sel_t *)0x0) {
              uVar22 = (ulong)psVar8[uVar35];
            }
            puVar3 = (local_2f8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (((puVar3 == (unsigned_long *)0x0) ||
                ((puVar3[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) &&
               (iVar19 = ::std::
                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(&local_2a0,(key_type *)(local_2e0 + uVar22 * 0x10)),
               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur != (__node_type *)0x0
               )) {
              dVar14 = '\x01';
              goto LAB_01b9c2fc;
            }
            uVar35 = uVar35 + 1;
            uVar37 = uVar37 - 1;
          } while (uVar37 != 0);
        }
        dVar14 = '\0';
      }
LAB_01b9c2fc:
      *pdVar4 = dVar14;
      goto LAB_01b9c2ff;
    }
  }
  else {
    iVar16 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      puVar5 = (ulong *)vec_00->data;
      puVar3 = (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = vec->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar31 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vec->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar16 != 0) {
            uVar22 = *puVar5;
            uVar37 = puVar5[1];
            iVar17 = 0;
            do {
              uVar36 = *(ulong *)(pdVar4 + iVar17 * 0x10 + 8);
              dVar14 = '\0';
              if ((uVar36 != 0) && (dVar14 = '\0', uVar37 != 0)) {
                if (uVar37 < uVar36) {
                  local_318 = (UnifiedVectorFormat *)local_98.data;
                  pUVar27 = &local_258;
                  local_2e8 = &local_210;
                  uVar35 = uVar22;
                  pdVar29 = local_100.data;
                  uVar30 = uVar36;
                  uVar33 = *(ulong *)(pdVar4 + iVar17 * 0x10);
                  uVar36 = uVar37;
                }
                else {
                  local_318 = (UnifiedVectorFormat *)local_100.data;
                  pUVar27 = &local_210;
                  local_2e8 = &local_258;
                  uVar35 = *(ulong *)(pdVar4 + iVar17 * 0x10);
                  pdVar29 = local_98.data;
                  uVar30 = uVar37;
                  uVar33 = uVar22;
                }
                ::std::
                _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::clear(&local_2a0);
                if (uVar35 < uVar36 + uVar35) {
                  do {
                    psVar8 = pUVar27->sel->sel_vector;
                    uVar25 = uVar35;
                    if (psVar8 != (sel_t *)0x0) {
                      uVar25 = (ulong)psVar8[uVar35];
                    }
                    puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_mask;
                    if ((puVar3 == (unsigned_long *)0x0) ||
                       ((puVar3[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                      local_1c8.sel = (SelectionVector *)&local_2a0;
                      ::std::
                      _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      ::
                      _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                  *)local_1c8.sel,pdVar29 + uVar25 * 0x10,&local_1c8);
                    }
                    uVar35 = uVar35 + 1;
                    uVar36 = uVar36 - 1;
                  } while (uVar36 != 0);
                }
                if (uVar33 < uVar30 + uVar33) {
                  do {
                    psVar8 = local_2e8->sel->sel_vector;
                    uVar36 = uVar33;
                    if (psVar8 != (sel_t *)0x0) {
                      uVar36 = (ulong)psVar8[uVar33];
                    }
                    puVar3 = (local_2e8->validity).super_TemplatedValidityMask<unsigned_long>.
                             validity_mask;
                    if (((puVar3 == (unsigned_long *)0x0) ||
                        ((puVar3[uVar36 >> 6] >> (uVar36 & 0x3f) & 1) != 0)) &&
                       (iVar19 = ::std::
                                 _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                 ::find(&local_2a0,(key_type *)((long)local_318 + uVar36 * 0x10)),
                       iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                       (__node_type *)0x0)) {
                      dVar14 = '\x01';
                      goto LAB_01b9b8c7;
                    }
                    uVar33 = uVar33 + 1;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                }
                dVar14 = '\0';
              }
LAB_01b9b8c7:
              pdVar31[iVar17] = dVar14;
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar16);
          }
        }
        else if (0x3f < iVar16 + 0x3f) {
          uVar37 = 0;
          uVar22 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar36 = uVar37 + 0x40;
              if (iVar16 <= uVar37 + 0x40) {
                uVar36 = iVar16;
              }
LAB_01b9ae39:
              uVar30 = uVar37;
              if (uVar37 < uVar36) {
                uVar35 = *puVar5;
                uVar33 = puVar5[1];
                do {
                  uVar30 = *(ulong *)(pdVar4 + uVar37 * 0x10 + 8);
                  dVar14 = '\0';
                  if ((uVar30 != 0) && (dVar14 = '\0', uVar33 != 0)) {
                    if (uVar33 < uVar30) {
                      local_310 = (UnifiedVectorFormat *)local_98.data;
                      pUVar27 = &local_258;
                      local_318 = &local_210;
                      uVar25 = uVar35;
                      pdVar29 = local_100.data;
                      uVar34 = uVar33;
                      uVar24 = *(ulong *)(pdVar4 + uVar37 * 0x10);
                    }
                    else {
                      local_310 = (UnifiedVectorFormat *)local_100.data;
                      pUVar27 = &local_210;
                      local_318 = &local_258;
                      uVar25 = *(ulong *)(pdVar4 + uVar37 * 0x10);
                      pdVar29 = local_98.data;
                      uVar34 = uVar30;
                      uVar24 = uVar35;
                      uVar30 = uVar33;
                    }
                    ::std::
                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::clear(&local_2a0);
                    if (uVar25 < uVar25 + uVar34) {
                      do {
                        psVar8 = pUVar27->sel->sel_vector;
                        uVar28 = uVar25;
                        if (psVar8 != (sel_t *)0x0) {
                          uVar28 = (ulong)psVar8[uVar25];
                        }
                        puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask;
                        if ((puVar3 == (unsigned_long *)0x0) ||
                           ((puVar3[uVar28 >> 6] >> (uVar28 & 0x3f) & 1) != 0)) {
                          local_1c8.sel = (SelectionVector *)&local_2a0;
                          ::std::
                          _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          ::
                          _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                    ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)local_1c8.sel,pdVar29 + uVar28 * 0x10,&local_1c8);
                        }
                        uVar25 = uVar25 + 1;
                        uVar34 = uVar34 - 1;
                      } while (uVar34 != 0);
                    }
                    if (uVar24 < uVar30 + uVar24) {
                      do {
                        psVar8 = local_318->sel->sel_vector;
                        uVar25 = uVar24;
                        if (psVar8 != (sel_t *)0x0) {
                          uVar25 = (ulong)psVar8[uVar24];
                        }
                        puVar3 = (local_318->validity).super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask;
                        if (((puVar3 == (unsigned_long *)0x0) ||
                            ((puVar3[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
                           (iVar19 = ::std::
                                     _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&local_2a0,(key_type *)((long)local_310 + uVar25 * 0x10)
                                           ),
                           iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                           (__node_type *)0x0)) {
                          dVar14 = '\x01';
                          goto LAB_01b9afdb;
                        }
                        uVar24 = uVar24 + 1;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    dVar14 = '\0';
                  }
LAB_01b9afdb:
                  pdVar31[uVar37] = dVar14;
                  uVar37 = uVar37 + 1;
                  uVar30 = uVar36;
                } while (uVar37 != uVar36);
              }
            }
            else {
              uVar35 = puVar3[uVar22];
              uVar36 = uVar37 + 0x40;
              if (iVar16 <= uVar37 + 0x40) {
                uVar36 = iVar16;
              }
              uVar30 = uVar36;
              if (uVar35 != 0) {
                if (uVar35 == 0xffffffffffffffff) goto LAB_01b9ae39;
                uVar30 = uVar37;
                uVar33 = uVar37;
                if (uVar37 < uVar36) {
                  do {
                    if ((uVar35 >> ((ulong)(uint)((int)uVar33 - (int)uVar37) & 0x3f) & 1) != 0) {
                      uVar30 = *(ulong *)(pdVar4 + uVar33 * 0x10 + 8);
                      dVar14 = '\0';
                      if ((uVar30 != 0) && (uVar25 = puVar5[1], uVar25 != 0)) {
                        uVar34 = *(ulong *)(pdVar4 + uVar33 * 0x10);
                        if (uVar25 < uVar30) {
                          local_318 = (UnifiedVectorFormat *)local_100.data;
                          local_2c0 = local_98.data;
                          pUVar27 = &local_258;
                          local_310 = &local_210;
                          uVar24 = uVar34;
                          uVar28 = uVar30;
                          uVar34 = *puVar5;
                          uVar30 = uVar25;
                        }
                        else {
                          local_318 = (UnifiedVectorFormat *)local_98.data;
                          local_2c0 = local_100.data;
                          pUVar27 = &local_210;
                          local_310 = &local_258;
                          uVar24 = *puVar5;
                          uVar28 = uVar25;
                        }
                        ::std::
                        _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        ::clear(&local_2a0);
                        if (uVar34 < uVar30 + uVar34) {
                          do {
                            psVar8 = pUVar27->sel->sel_vector;
                            uVar25 = uVar34;
                            if (psVar8 != (sel_t *)0x0) {
                              uVar25 = (ulong)psVar8[uVar34];
                            }
                            puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                                     validity_mask;
                            if ((puVar3 == (unsigned_long *)0x0) ||
                               ((puVar3[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                              local_1c8.sel = (SelectionVector *)&local_2a0;
                              ::std::
                              _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                              ::
                              _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                        ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                          *)local_1c8.sel,
                                         (data_ptr_t)((long)local_318 + uVar25 * 0x10),&local_1c8);
                            }
                            uVar34 = uVar34 + 1;
                            uVar30 = uVar30 - 1;
                          } while (uVar30 != 0);
                        }
                        if (uVar24 < uVar24 + uVar28) {
                          do {
                            psVar8 = local_310->sel->sel_vector;
                            uVar30 = uVar24;
                            if (psVar8 != (sel_t *)0x0) {
                              uVar30 = (ulong)psVar8[uVar24];
                            }
                            puVar3 = (local_310->validity).
                                     super_TemplatedValidityMask<unsigned_long>.validity_mask;
                            if (((puVar3 == (unsigned_long *)0x0) ||
                                ((puVar3[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) &&
                               (iVar19 = ::std::
                                         _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                         ::find(&local_2a0,(key_type *)(local_2c0 + uVar30 * 0x10)),
                               iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                               (__node_type *)0x0)) {
                              dVar14 = '\x01';
                              goto LAB_01b9ae0a;
                            }
                            uVar24 = uVar24 + 1;
                            uVar28 = uVar28 - 1;
                          } while (uVar28 != 0);
                        }
                        dVar14 = '\0';
                      }
LAB_01b9ae0a:
                      pdVar31[uVar33] = dVar14;
                    }
                    uVar33 = uVar33 + 1;
                    uVar30 = uVar36;
                  } while (uVar33 != uVar36);
                }
              }
            }
            uVar37 = uVar30;
            uVar22 = uVar22 + 1;
          } while (uVar22 != iVar16 + 0x3f >> 6);
        }
        goto LAB_01b9c2ff;
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar4 = vec->data;
          pdVar31 = vec_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar29 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vec);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vec->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vec_00);
          this_02 = &result->validity;
          ValidityMask::Combine(this_02,&vec_00->validity,iVar16);
          if ((this_02->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar16 != 0) {
              iVar17 = 0;
              do {
                lVar23 = iVar17 * 0x10;
                uVar22 = *(ulong *)(pdVar4 + lVar23 + 8);
                dVar14 = '\0';
                if ((uVar22 != 0) && (uVar37 = *(ulong *)(pdVar31 + lVar23 + 8), uVar37 != 0)) {
                  uVar36 = *(ulong *)(pdVar31 + lVar23);
                  if (uVar37 < uVar22) {
                    local_318 = (UnifiedVectorFormat *)local_98.data;
                    pUVar27 = &local_258;
                    local_2f8 = &local_210;
                    uVar35 = uVar36;
                    pdVar26 = local_100.data;
                    uVar30 = uVar22;
                    uVar36 = *(ulong *)(pdVar4 + lVar23);
                    uVar22 = uVar37;
                  }
                  else {
                    local_318 = (UnifiedVectorFormat *)local_100.data;
                    pUVar27 = &local_210;
                    local_2f8 = &local_258;
                    uVar35 = *(ulong *)(pdVar4 + lVar23);
                    pdVar26 = local_98.data;
                    uVar30 = uVar37;
                  }
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_2a0);
                  if (uVar35 < uVar22 + uVar35) {
                    do {
                      psVar8 = pUVar27->sel->sel_vector;
                      uVar37 = uVar35;
                      if (psVar8 != (sel_t *)0x0) {
                        uVar37 = (ulong)psVar8[uVar35];
                      }
                      puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_mask;
                      if ((puVar3 == (unsigned_long *)0x0) ||
                         ((puVar3[uVar37 >> 6] >> (uVar37 & 0x3f) & 1) != 0)) {
                        local_1c8.sel = (SelectionVector *)&local_2a0;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)local_1c8.sel,pdVar26 + uVar37 * 0x10,&local_1c8);
                      }
                      uVar35 = uVar35 + 1;
                      uVar22 = uVar22 - 1;
                    } while (uVar22 != 0);
                  }
                  if (uVar36 < uVar36 + uVar30) {
                    do {
                      psVar8 = local_2f8->sel->sel_vector;
                      uVar22 = uVar36;
                      if (psVar8 != (sel_t *)0x0) {
                        uVar22 = (ulong)psVar8[uVar36];
                      }
                      puVar3 = (local_2f8->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_mask;
                      if (((puVar3 == (unsigned_long *)0x0) ||
                          ((puVar3[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) &&
                         (iVar19 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_2a0,(key_type *)((long)local_318 + uVar22 * 0x10)),
                         iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                         (__node_type *)0x0)) {
                        dVar14 = '\x01';
                        goto LAB_01b9c55a;
                      }
                      uVar36 = uVar36 + 1;
                      uVar30 = uVar30 - 1;
                    } while (uVar30 != 0);
                  }
                  dVar14 = '\0';
                }
LAB_01b9c55a:
                pdVar29[iVar17] = dVar14;
                iVar17 = iVar17 + 1;
              } while (iVar17 != iVar16);
            }
          }
          else if (0x3f < iVar16 + 0x3f) {
            uVar37 = 0;
            uVar22 = 0;
            do {
              puVar3 = (this_02->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar36 = uVar22 + 0x40;
                if (iVar16 <= uVar22 + 0x40) {
                  uVar36 = iVar16;
                }
LAB_01b9bc99:
                uVar30 = uVar22;
                if (uVar22 < uVar36) {
                  do {
                    lVar23 = uVar22 * 0x10;
                    uVar35 = *(ulong *)(pdVar4 + lVar23 + 8);
                    dVar14 = '\0';
                    if ((uVar35 != 0) && (uVar30 = *(ulong *)(pdVar31 + lVar23 + 8), uVar30 != 0)) {
                      uVar33 = *(ulong *)(pdVar31 + lVar23);
                      if (uVar30 < uVar35) {
                        local_318 = (UnifiedVectorFormat *)local_98.data;
                        pUVar27 = &local_258;
                        local_308 = &local_210;
                        pdVar26 = local_100.data;
                        uVar25 = uVar30;
                        uVar34 = uVar33;
                        uVar30 = uVar35;
                        uVar33 = *(ulong *)(pdVar4 + lVar23);
                      }
                      else {
                        local_318 = (UnifiedVectorFormat *)local_100.data;
                        pUVar27 = &local_210;
                        local_308 = &local_258;
                        pdVar26 = local_98.data;
                        uVar25 = uVar35;
                        uVar34 = *(ulong *)(pdVar4 + lVar23);
                      }
                      ::std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_2a0);
                      if (uVar34 < uVar25 + uVar34) {
                        do {
                          psVar8 = pUVar27->sel->sel_vector;
                          uVar35 = uVar34;
                          if (psVar8 != (sel_t *)0x0) {
                            uVar35 = (ulong)psVar8[uVar34];
                          }
                          puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                                   validity_mask;
                          if ((puVar3 == (unsigned_long *)0x0) ||
                             ((puVar3[uVar35 >> 6] >> (uVar35 & 0x3f) & 1) != 0)) {
                            local_1c8.sel = (SelectionVector *)&local_2a0;
                            ::std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)local_1c8.sel,pdVar26 + uVar35 * 0x10,&local_1c8);
                          }
                          uVar34 = uVar34 + 1;
                          uVar25 = uVar25 - 1;
                        } while (uVar25 != 0);
                      }
                      if (uVar33 < uVar30 + uVar33) {
                        do {
                          psVar8 = local_308->sel->sel_vector;
                          uVar35 = uVar33;
                          if (psVar8 != (sel_t *)0x0) {
                            uVar35 = (ulong)psVar8[uVar33];
                          }
                          puVar3 = (local_308->validity).super_TemplatedValidityMask<unsigned_long>.
                                   validity_mask;
                          if (((puVar3 == (unsigned_long *)0x0) ||
                              ((puVar3[uVar35 >> 6] >> (uVar35 & 0x3f) & 1) != 0)) &&
                             (iVar19 = ::std::
                                       _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                       ::find(&local_2a0,
                                              (key_type *)((long)local_318 + uVar35 * 0x10)),
                             iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                             (__node_type *)0x0)) {
                            dVar14 = '\x01';
                            goto LAB_01b9be18;
                          }
                          uVar33 = uVar33 + 1;
                          uVar30 = uVar30 - 1;
                        } while (uVar30 != 0);
                      }
                      dVar14 = '\0';
                    }
LAB_01b9be18:
                    pdVar29[uVar22] = dVar14;
                    uVar22 = uVar22 + 1;
                    uVar30 = uVar36;
                  } while (uVar22 != uVar36);
                }
              }
              else {
                uVar35 = puVar3[uVar37];
                uVar36 = uVar22 + 0x40;
                if (iVar16 <= uVar22 + 0x40) {
                  uVar36 = iVar16;
                }
                uVar30 = uVar36;
                if (uVar35 != 0) {
                  if (uVar35 == 0xffffffffffffffff) goto LAB_01b9bc99;
                  uVar30 = uVar22;
                  uVar33 = uVar22;
                  if (uVar22 < uVar36) {
                    do {
                      if ((uVar35 >> ((ulong)(uint)((int)uVar33 - (int)uVar22) & 0x3f) & 1) != 0) {
                        lVar23 = uVar33 * 0x10;
                        uVar30 = *(ulong *)(pdVar4 + lVar23 + 8);
                        dVar14 = '\0';
                        if ((uVar30 != 0) &&
                           (uVar25 = *(ulong *)(pdVar31 + lVar23 + 8), uVar25 != 0)) {
                          uVar34 = *(ulong *)(pdVar4 + lVar23);
                          if (uVar25 < uVar30) {
                            local_318 = (UnifiedVectorFormat *)local_100.data;
                            local_2c0 = local_98.data;
                            pUVar27 = &local_258;
                            local_308 = &local_210;
                            uVar24 = uVar34;
                            uVar28 = uVar30;
                            uVar30 = uVar25;
                            uVar34 = *(ulong *)(pdVar31 + lVar23);
                          }
                          else {
                            local_318 = (UnifiedVectorFormat *)local_98.data;
                            local_2c0 = local_100.data;
                            pUVar27 = &local_210;
                            local_308 = &local_258;
                            uVar24 = *(ulong *)(pdVar31 + lVar23);
                            uVar28 = uVar25;
                          }
                          ::std::
                          _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          ::clear(&local_2a0);
                          if (uVar34 < uVar30 + uVar34) {
                            do {
                              psVar8 = pUVar27->sel->sel_vector;
                              uVar25 = uVar34;
                              if (psVar8 != (sel_t *)0x0) {
                                uVar25 = (ulong)psVar8[uVar34];
                              }
                              puVar3 = (pUVar27->validity).
                                       super_TemplatedValidityMask<unsigned_long>.validity_mask;
                              if ((puVar3 == (unsigned_long *)0x0) ||
                                 ((puVar3[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                                local_1c8.sel = (SelectionVector *)&local_2a0;
                                ::std::
                                _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                ::
                                _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                          ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                            *)local_1c8.sel,
                                           (data_ptr_t)((long)local_318 + uVar25 * 0x10),&local_1c8)
                                ;
                              }
                              uVar34 = uVar34 + 1;
                              uVar30 = uVar30 - 1;
                            } while (uVar30 != 0);
                          }
                          if (uVar24 < uVar28 + uVar24) {
                            do {
                              psVar8 = local_308->sel->sel_vector;
                              uVar30 = uVar24;
                              if (psVar8 != (sel_t *)0x0) {
                                uVar30 = (ulong)psVar8[uVar24];
                              }
                              puVar3 = (local_308->validity).
                                       super_TemplatedValidityMask<unsigned_long>.validity_mask;
                              if (((puVar3 == (unsigned_long *)0x0) ||
                                  ((puVar3[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) &&
                                 (iVar19 = ::std::
                                           _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                           ::find(&local_2a0,(key_type *)(local_2c0 + uVar30 * 0x10)
                                                 ),
                                 iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                                 (__node_type *)0x0)) {
                                dVar14 = '\x01';
                                goto LAB_01b9bc6f;
                              }
                              uVar24 = uVar24 + 1;
                              uVar28 = uVar28 - 1;
                            } while (uVar28 != 0);
                          }
                          dVar14 = '\0';
                        }
LAB_01b9bc6f:
                        pdVar29[uVar33] = dVar14;
                      }
                      uVar33 = uVar33 + 1;
                      uVar30 = uVar36;
                    } while (uVar33 != uVar36);
                  }
                }
              }
              uVar37 = uVar37 + 1;
              uVar22 = uVar30;
            } while (uVar37 != iVar16 + 0x3f >> 6);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_1c8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_148);
          Vector::ToUnifiedFormat(vec,iVar16,&local_1c8);
          Vector::ToUnifiedFormat(vec_00,iVar16,&local_148);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pSVar12 = local_1c8.sel;
          pdVar4 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_1c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar16 != 0) {
              pp_Var6 = (__buckets_ptr)pSVar12->sel_vector;
              psVar8 = (local_148.sel)->sel_vector;
              iVar17 = 0;
              do {
                iVar18 = iVar17;
                if (pp_Var6 != (__buckets_ptr)0x0) {
                  iVar18 = (idx_t)*(uint *)((long)pp_Var6 + iVar17 * 4);
                }
                iVar32 = iVar17;
                if (psVar8 != (sel_t *)0x0) {
                  iVar32 = (idx_t)psVar8[iVar17];
                }
                uVar22 = *(ulong *)(local_1c8.data + iVar18 * 0x10 + 8);
                dVar14 = '\0';
                if (uVar22 != 0) {
                  uVar37 = *(ulong *)(local_148.data + iVar32 * 0x10 + 8);
                  dVar14 = '\0';
                  if (uVar37 != 0) {
                    uVar36 = *(ulong *)(local_148.data + iVar32 * 0x10);
                    if (uVar37 < uVar22) {
                      local_318 = (UnifiedVectorFormat *)local_98.data;
                      pUVar27 = &local_258;
                      local_2f8 = &local_210;
                      uVar35 = uVar22;
                      pdVar31 = local_100.data;
                      uVar30 = uVar36;
                      uVar36 = *(ulong *)(local_1c8.data + iVar18 * 0x10);
                      uVar22 = uVar37;
                    }
                    else {
                      local_318 = (UnifiedVectorFormat *)local_100.data;
                      pUVar27 = &local_210;
                      local_2f8 = &local_258;
                      uVar35 = uVar37;
                      pdVar31 = local_98.data;
                      uVar30 = *(ulong *)(local_1c8.data + iVar18 * 0x10);
                    }
                    ::std::
                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::clear(&local_2a0);
                    if (uVar30 < uVar22 + uVar30) {
                      do {
                        psVar7 = pUVar27->sel->sel_vector;
                        uVar37 = uVar30;
                        if (psVar7 != (sel_t *)0x0) {
                          uVar37 = (ulong)psVar7[uVar30];
                        }
                        puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask;
                        if ((puVar3 == (unsigned_long *)0x0) ||
                           ((puVar3[uVar37 >> 6] >> (uVar37 & 0x3f) & 1) != 0)) {
                          local_268 = &local_2a0;
                          ::std::
                          _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          ::
                          _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                    ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)local_268,pdVar31 + uVar37 * 0x10,&local_268);
                        }
                        uVar30 = uVar30 + 1;
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                    if (uVar36 < uVar35 + uVar36) {
                      do {
                        psVar7 = local_2f8->sel->sel_vector;
                        uVar22 = uVar36;
                        if (psVar7 != (sel_t *)0x0) {
                          uVar22 = (ulong)psVar7[uVar36];
                        }
                        puVar3 = (local_2f8->validity).super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask;
                        if (((puVar3 == (unsigned_long *)0x0) ||
                            ((puVar3[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) &&
                           (iVar19 = ::std::
                                     _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&local_2a0,(key_type *)((long)local_318 + uVar22 * 0x10)
                                           ),
                           iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                           (__node_type *)0x0)) {
                          dVar14 = '\x01';
                          goto LAB_01b9b2ba;
                        }
                        uVar36 = uVar36 + 1;
                        uVar35 = uVar35 - 1;
                      } while (uVar35 != 0);
                    }
                    dVar14 = '\0';
                  }
                }
LAB_01b9b2ba:
                pdVar4[iVar17] = dVar14;
                iVar17 = iVar17 + 1;
              } while (iVar17 != iVar16);
            }
          }
          else if (iVar16 != 0) {
            pp_Var6 = (__buckets_ptr)pSVar12->sel_vector;
            psVar8 = (local_148.sel)->sel_vector;
            uVar22 = 0;
            do {
              uVar37 = uVar22;
              if (pp_Var6 != (__buckets_ptr)0x0) {
                uVar37 = (ulong)*(uint *)((long)pp_Var6 + uVar22 * 4);
              }
              uVar36 = uVar22;
              if (psVar8 != (sel_t *)0x0) {
                uVar36 = (ulong)psVar8[uVar22];
              }
              if (((local_1c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_1c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar37 >> 6] >> (uVar37 & 0x3f) & 1) != 0)) &&
                 ((local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar36 >> 6] >> (uVar36 & 0x3f) & 1) != 0)))) {
                uVar35 = *(ulong *)(local_1c8.data + uVar37 * 0x10 + 8);
                dVar14 = '\0';
                if (uVar35 != 0) {
                  uVar30 = *(ulong *)(local_148.data + uVar36 * 0x10 + 8);
                  if (uVar30 != 0) {
                    uVar36 = *(ulong *)(local_148.data + uVar36 * 0x10);
                    if (uVar30 < uVar35) {
                      local_300 = local_98.data;
                      pUVar27 = &local_258;
                      local_318 = &local_210;
                      pdVar31 = local_100.data;
                      uVar33 = uVar36;
                      uVar36 = *(ulong *)(local_1c8.data + uVar37 * 0x10);
                      uVar37 = uVar35;
                      uVar35 = uVar30;
                    }
                    else {
                      local_300 = local_100.data;
                      pUVar27 = &local_210;
                      local_318 = &local_258;
                      pdVar31 = local_98.data;
                      uVar33 = *(ulong *)(local_1c8.data + uVar37 * 0x10);
                      uVar37 = uVar30;
                    }
                    ::std::
                    _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::clear(&local_2a0);
                    if (uVar33 < uVar35 + uVar33) {
                      do {
                        psVar7 = pUVar27->sel->sel_vector;
                        uVar30 = uVar33;
                        if (psVar7 != (sel_t *)0x0) {
                          uVar30 = (ulong)psVar7[uVar33];
                        }
                        puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask;
                        if ((puVar3 == (unsigned_long *)0x0) ||
                           ((puVar3[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)) {
                          local_268 = &local_2a0;
                          ::std::
                          _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          ::
                          _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                    ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                      *)local_268,pdVar31 + uVar30 * 0x10,&local_268);
                        }
                        uVar33 = uVar33 + 1;
                        uVar35 = uVar35 - 1;
                      } while (uVar35 != 0);
                    }
                    if (uVar36 < uVar37 + uVar36) {
                      do {
                        psVar7 = local_318->sel->sel_vector;
                        uVar35 = uVar36;
                        if (psVar7 != (sel_t *)0x0) {
                          uVar35 = (ulong)psVar7[uVar36];
                        }
                        puVar3 = (local_318->validity).super_TemplatedValidityMask<unsigned_long>.
                                 validity_mask;
                        if (((puVar3 == (unsigned_long *)0x0) ||
                            ((puVar3[uVar35 >> 6] >> (uVar35 & 0x3f) & 1) != 0)) &&
                           (iVar19 = ::std::
                                     _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&local_2a0,(key_type *)(local_300 + uVar35 * 0x10)),
                           iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                           (__node_type *)0x0)) {
                          dVar14 = '\x01';
                          goto LAB_01b9c0ee;
                        }
                        uVar36 = uVar36 + 1;
                        uVar37 = uVar37 - 1;
                      } while (uVar37 != 0);
                    }
                    dVar14 = '\0';
                  }
                }
LAB_01b9c0ee:
                pdVar4[uVar22] = dVar14;
              }
              else {
                _Var21._M_head_impl =
                     (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var21._M_head_impl == (unsigned_long *)0x0) {
                  local_180 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                  ;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_268,&local_180);
                  p_Var11 = p_Stack_260;
                  p_Var10 = local_268;
                  local_268 = (_Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)0x0;
                  p_Stack_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)p_Var10;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var11;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_260);
                  }
                  pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  _Var21._M_head_impl =
                       (pTVar20->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var21._M_head_impl;
                }
                bVar9 = (byte)uVar22 & 0x3f;
                _Var21._M_head_impl[uVar22 >> 6] =
                     _Var21._M_head_impl[uVar22 >> 6] &
                     (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 != iVar16);
          }
          if (local_148.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_148.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_1c8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1c8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_1c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        goto LAB_01b9c2ff;
      }
      puVar5 = (ulong *)vec->data;
      puVar3 = (vec->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar4 = vec_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar31 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vec_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vec_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vec_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (iVar16 != 0) {
            uVar22 = *puVar5;
            uVar37 = puVar5[1];
            iVar17 = 0;
            do {
              dVar14 = '\0';
              if (uVar37 != 0) {
                uVar36 = *(ulong *)(pdVar4 + iVar17 * 0x10 + 8);
                dVar14 = '\0';
                if (uVar36 != 0) {
                  uVar35 = *(ulong *)(pdVar4 + iVar17 * 0x10);
                  if (uVar36 < uVar37) {
                    local_318 = (UnifiedVectorFormat *)local_98.data;
                    pUVar27 = &local_258;
                    local_2f8 = &local_210;
                    uVar30 = uVar35;
                    uVar33 = uVar37;
                    pdVar29 = local_100.data;
                    uVar35 = uVar22;
                  }
                  else {
                    local_318 = (UnifiedVectorFormat *)local_100.data;
                    pUVar27 = &local_210;
                    local_2f8 = &local_258;
                    uVar30 = uVar22;
                    uVar33 = uVar36;
                    pdVar29 = local_98.data;
                    uVar36 = uVar37;
                  }
                  ::std::
                  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::clear(&local_2a0);
                  if (uVar30 < uVar36 + uVar30) {
                    do {
                      psVar8 = pUVar27->sel->sel_vector;
                      uVar25 = uVar30;
                      if (psVar8 != (sel_t *)0x0) {
                        uVar25 = (ulong)psVar8[uVar30];
                      }
                      puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_mask;
                      if ((puVar3 == (unsigned_long *)0x0) ||
                         ((puVar3[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) {
                        local_1c8.sel = (SelectionVector *)&local_2a0;
                        ::std::
                        _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        ::
                        _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                  ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                    *)local_1c8.sel,pdVar29 + uVar25 * 0x10,&local_1c8);
                      }
                      uVar30 = uVar30 + 1;
                      uVar36 = uVar36 - 1;
                    } while (uVar36 != 0);
                  }
                  if (uVar35 < uVar35 + uVar33) {
                    do {
                      psVar8 = local_2f8->sel->sel_vector;
                      uVar36 = uVar35;
                      if (psVar8 != (sel_t *)0x0) {
                        uVar36 = (ulong)psVar8[uVar35];
                      }
                      puVar3 = (local_2f8->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_mask;
                      if (((puVar3 == (unsigned_long *)0x0) ||
                          ((puVar3[uVar36 >> 6] >> (uVar36 & 0x3f) & 1) != 0)) &&
                         (iVar19 = ::std::
                                   _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                   ::find(&local_2a0,(key_type *)((long)local_318 + uVar36 * 0x10)),
                         iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                         (__node_type *)0x0)) {
                        dVar14 = '\x01';
                        goto LAB_01b9c2dc;
                      }
                      uVar35 = uVar35 + 1;
                      uVar33 = uVar33 - 1;
                    } while (uVar33 != 0);
                  }
                  dVar14 = '\0';
                }
              }
LAB_01b9c2dc:
              pdVar31[iVar17] = dVar14;
              iVar17 = iVar17 + 1;
            } while (iVar17 != iVar16);
          }
        }
        else if (0x3f < iVar16 + 0x3f) {
          uVar22 = 0;
          local_2b0 = 0;
          do {
            puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              uVar37 = uVar22 + 0x40;
              if (iVar16 <= uVar22 + 0x40) {
                uVar37 = iVar16;
              }
LAB_01b9b56a:
              uVar35 = uVar22;
              if (uVar22 < uVar37) {
                uVar36 = *puVar5;
                uVar30 = puVar5[1];
                do {
                  dVar14 = '\0';
                  if (uVar30 != 0) {
                    uVar35 = *(ulong *)(pdVar4 + uVar22 * 0x10 + 8);
                    dVar14 = '\0';
                    if (uVar35 != 0) {
                      uVar33 = *(ulong *)(pdVar4 + uVar22 * 0x10);
                      if (uVar35 < uVar30) {
                        local_318 = (UnifiedVectorFormat *)local_98.data;
                        pUVar27 = &local_258;
                        local_308 = &local_210;
                        uVar25 = uVar33;
                        uVar34 = uVar35;
                        pdVar29 = local_100.data;
                        uVar33 = uVar36;
                        uVar35 = uVar30;
                      }
                      else {
                        local_318 = (UnifiedVectorFormat *)local_100.data;
                        pUVar27 = &local_210;
                        local_308 = &local_258;
                        uVar25 = uVar36;
                        uVar34 = uVar30;
                        pdVar29 = local_98.data;
                      }
                      ::std::
                      _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::clear(&local_2a0);
                      if (uVar25 < uVar25 + uVar34) {
                        do {
                          psVar8 = pUVar27->sel->sel_vector;
                          uVar24 = uVar25;
                          if (psVar8 != (sel_t *)0x0) {
                            uVar24 = (ulong)psVar8[uVar25];
                          }
                          puVar3 = (pUVar27->validity).super_TemplatedValidityMask<unsigned_long>.
                                   validity_mask;
                          if ((puVar3 == (unsigned_long *)0x0) ||
                             ((puVar3[uVar24 >> 6] >> (uVar24 & 0x3f) & 1) != 0)) {
                            local_1c8.sel = (SelectionVector *)&local_2a0;
                            ::std::
                            _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            ::
                            _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                      ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                        *)local_1c8.sel,pdVar29 + uVar24 * 0x10,&local_1c8);
                          }
                          uVar25 = uVar25 + 1;
                          uVar34 = uVar34 - 1;
                        } while (uVar34 != 0);
                      }
                      if (uVar33 < uVar35 + uVar33) {
                        do {
                          psVar8 = local_308->sel->sel_vector;
                          uVar25 = uVar33;
                          if (psVar8 != (sel_t *)0x0) {
                            uVar25 = (ulong)psVar8[uVar33];
                          }
                          puVar3 = (local_308->validity).super_TemplatedValidityMask<unsigned_long>.
                                   validity_mask;
                          if (((puVar3 == (unsigned_long *)0x0) ||
                              ((puVar3[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0)) &&
                             (iVar19 = ::std::
                                       _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                       ::find(&local_2a0,
                                              (key_type *)((long)local_318 + uVar25 * 0x10)),
                             iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                             (__node_type *)0x0)) {
                            dVar14 = '\x01';
                            goto LAB_01b9b6fa;
                          }
                          uVar33 = uVar33 + 1;
                          uVar35 = uVar35 - 1;
                        } while (uVar35 != 0);
                      }
                      dVar14 = '\0';
                    }
                  }
LAB_01b9b6fa:
                  pdVar31[uVar22] = dVar14;
                  uVar22 = uVar22 + 1;
                  uVar35 = uVar37;
                } while (uVar22 != uVar37);
              }
            }
            else {
              uVar36 = puVar3[local_2b0];
              uVar37 = uVar22 + 0x40;
              if (iVar16 <= uVar22 + 0x40) {
                uVar37 = iVar16;
              }
              uVar35 = uVar37;
              if (uVar36 != 0) {
                if (uVar36 == 0xffffffffffffffff) goto LAB_01b9b56a;
                uVar30 = uVar22;
                uVar35 = uVar22;
                if (uVar22 < uVar37) {
                  do {
                    if ((uVar36 >> ((ulong)(uint)((int)uVar30 - (int)uVar22) & 0x3f) & 1) != 0) {
                      uVar35 = puVar5[1];
                      dVar14 = '\0';
                      if (uVar35 != 0) {
                        uVar33 = *(ulong *)(pdVar4 + uVar30 * 0x10 + 8);
                        if (uVar33 != 0) {
                          uVar25 = *puVar5;
                          if (uVar33 < uVar35) {
                            local_318 = (UnifiedVectorFormat *)local_100.data;
                            local_308 = (UnifiedVectorFormat *)local_98.data;
                            pUVar27 = &local_258;
                            local_2c8 = &local_210;
                            uVar34 = uVar25;
                            uVar24 = uVar35;
                            uVar35 = uVar33;
                            uVar25 = *(ulong *)(pdVar4 + uVar30 * 0x10);
                          }
                          else {
                            local_318 = (UnifiedVectorFormat *)local_98.data;
                            local_308 = (UnifiedVectorFormat *)local_100.data;
                            pUVar27 = &local_210;
                            local_2c8 = &local_258;
                            uVar34 = *(ulong *)(pdVar4 + uVar30 * 0x10);
                            uVar24 = uVar33;
                          }
                          ::std::
                          _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          ::clear(&local_2a0);
                          if (uVar25 < uVar25 + uVar35) {
                            do {
                              psVar8 = pUVar27->sel->sel_vector;
                              uVar33 = uVar25;
                              if (psVar8 != (sel_t *)0x0) {
                                uVar33 = (ulong)psVar8[uVar25];
                              }
                              puVar3 = (pUVar27->validity).
                                       super_TemplatedValidityMask<unsigned_long>.validity_mask;
                              if ((puVar3 == (unsigned_long *)0x0) ||
                                 ((puVar3[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) != 0)) {
                                local_1c8.sel = (SelectionVector *)&local_2a0;
                                ::std::
                                _Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                ::
                                _M_insert<duckdb::string_t_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::string_t,true>>>>
                                          ((_Hashtable<duckdb::string_t,duckdb::string_t,std::allocator<duckdb::string_t>,std::__detail::_Identity,duckdb::StringEquality,duckdb::StringHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                            *)local_1c8.sel,
                                           (data_ptr_t)((long)local_318 + uVar33 * 0x10),&local_1c8)
                                ;
                              }
                              uVar25 = uVar25 + 1;
                              uVar35 = uVar35 - 1;
                            } while (uVar35 != 0);
                          }
                          if (uVar34 < uVar24 + uVar34) {
                            do {
                              psVar8 = local_2c8->sel->sel_vector;
                              uVar35 = uVar34;
                              if (psVar8 != (sel_t *)0x0) {
                                uVar35 = (ulong)psVar8[uVar34];
                              }
                              puVar3 = (local_2c8->validity).
                                       super_TemplatedValidityMask<unsigned_long>.validity_mask;
                              if (((puVar3 == (unsigned_long *)0x0) ||
                                  ((puVar3[uVar35 >> 6] >> (uVar35 & 0x3f) & 1) != 0)) &&
                                 (iVar19 = ::std::
                                           _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                           ::find(&local_2a0,
                                                  (key_type *)((long)local_308 + uVar35 * 0x10)),
                                 iVar19.super__Node_iterator_base<duckdb::string_t,_true>._M_cur !=
                                 (__node_type *)0x0)) {
                                dVar14 = '\x01';
                                goto LAB_01b9b53c;
                              }
                              uVar34 = uVar34 + 1;
                              uVar24 = uVar24 - 1;
                            } while (uVar24 != 0);
                          }
                          dVar14 = '\0';
                        }
                      }
LAB_01b9b53c:
                      pdVar31[uVar30] = dVar14;
                    }
                    uVar30 = uVar30 + 1;
                    uVar35 = uVar37;
                  } while (uVar30 != uVar37);
                }
              }
            }
            uVar22 = uVar35;
            local_2b0 = local_2b0 + 1;
          } while (local_2b0 != iVar16 + 0x3f >> 6);
        }
        goto LAB_01b9c2ff;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
LAB_01b9c2ff:
  ::std::
  _Hashtable<duckdb::string_t,_duckdb::string_t,_std::allocator<duckdb::string_t>,_std::__detail::_Identity,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2a0);
  if (local_100.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_100.type);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_258.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_210.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_210.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  return;
}

Assistant:

static void ListHasAnyFunction(DataChunk &args, ExpressionState &, Vector &result) {

	auto &l_vec = args.data[0];
	auto &r_vec = args.data[1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL ||
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = false;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat l_child_format;
	UnifiedVectorFormat r_child_format;

	l_child.ToUnifiedFormat(l_size, l_child_format);
	r_child.ToUnifiedFormat(r_size, r_child_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto l_sortkey_ptr = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto r_sortkey_ptr = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &l_list, const list_entry_t &r_list) {
		    // Short circuit if either list is empty
		    if (l_list.length == 0 || r_list.length == 0) {
			    return false;
		    }

		    auto build_list = l_list;
		    auto probe_list = r_list;

		    auto build_data = l_sortkey_ptr;
		    auto probe_data = r_sortkey_ptr;

		    auto build_format = &l_child_format;
		    auto probe_format = &r_child_format;

		    // Use the smaller list to build the set
		    if (r_list.length < l_list.length) {

			    build_list = r_list;
			    probe_list = l_list;

			    build_data = r_sortkey_ptr;
			    probe_data = l_sortkey_ptr;

			    build_format = &r_child_format;
			    probe_format = &l_child_format;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format->sel->get_index(idx);
			    if (build_format->validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }
		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format->sel->get_index(idx);
			    if (probe_format->validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) != set.end()) {
				    return true;
			    }
		    }
		    return false;
	    });
}